

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_dgemv_toe(int m,int n,double alpha,double *a,int lda,double *x,int incx,double beta,
                 double *y,int incy,double *z,int incz)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  bool bVar7;
  double dVar8;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf3,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf4,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf5,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (z == (double *)0x0) {
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf6,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == z) {
    __assert_fail("x != z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf7,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == y) {
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf8,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xf9,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (incx < 1) {
    __assert_fail("incx > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xfa,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (incy < 1) {
    __assert_fail("incy > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xfb,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (incz < 1) {
    __assert_fail("incz > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xfc,
                  "void la_dgemv_toe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)m;
  if (m < 1) {
    uVar2 = uVar3;
  }
  uVar1 = (ulong)(uint)n;
  if (n < 1) {
    uVar1 = uVar3;
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    dVar8 = y[uVar3 * (uint)incy] * beta;
    pdVar4 = a;
    uVar5 = uVar2;
    pdVar6 = x;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      dVar8 = dVar8 + *pdVar4 * alpha * *pdVar6;
      pdVar4 = pdVar4 + (uint)lda;
      pdVar6 = pdVar6 + (uint)incx;
    }
    z[uVar3 * (uint)incz] = dVar8;
    a = a + 1;
  }
  return;
}

Assistant:

void la_dgemv_toe(
        int m, int n,
        double alpha,
        const double *a, int lda,
        const double *x, int incx,
        double beta,
        const double *y, int incy,
        double *z, int incz)
{
    assert(a);
    assert(x);
    assert(y);
    assert(z);
    assert(x != z);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);
    assert(incz > 0);

    for (int i = 0; i < n; i++) {
        double zi = beta * y[i * incy];
        for (int j = 0; j < m; j++) {
            zi += alpha * a[j * lda + i] * x[j * incx];
        }
        z[i * incz] = zi;
    }
}